

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O1

void __thiscall
bloaty::anon_unknown_0::ElfFile::StructReader::Memcpy<Elf64_Phdr>
          (StructReader *this,uint64_t offset,string_view *out_range,Elf64_Phdr *out)

{
  ulong uVar1;
  char *pcVar2;
  undefined8 uVar3;
  Elf64_Off EVar4;
  Elf64_Addr EVar5;
  Elf64_Addr EVar6;
  Elf64_Xword EVar7;
  size_t sVar8;
  
  if (0xffffffffffffffc7 < offset) {
    Throw("integer overflow in addition",0x4b);
  }
  uVar1 = (this->data_)._M_len;
  if (offset + 0x38 <= uVar1) {
    if (offset <= uVar1) {
      if (out_range != (string_view *)0x0) {
        pcVar2 = (this->data_)._M_str;
        sVar8 = 0x38;
        if (uVar1 - offset < 0x38) {
          sVar8 = uVar1 - offset;
        }
        out_range->_M_len = sVar8;
        out_range->_M_str = pcVar2 + offset;
      }
      pcVar2 = (this->data_)._M_str;
      out->p_align = *(Elf64_Xword *)(pcVar2 + offset + 0x30);
      uVar3 = *(undefined8 *)(pcVar2 + offset);
      EVar4 = *(Elf64_Off *)(pcVar2 + offset + 8);
      EVar5 = *(Elf64_Addr *)(pcVar2 + offset + 0x10);
      EVar6 = *(Elf64_Addr *)((long)(pcVar2 + offset + 0x10) + 8);
      EVar7 = *(Elf64_Xword *)((long)(pcVar2 + offset + 0x20) + 8);
      out->p_filesz = *(Elf64_Xword *)(pcVar2 + offset + 0x20);
      out->p_memsz = EVar7;
      out->p_vaddr = EVar5;
      out->p_paddr = EVar6;
      out->p_type = (int)uVar3;
      out->p_flags = (int)((ulong)uVar3 >> 0x20);
      out->p_offset = EVar4;
      return;
    }
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",offset
               ,uVar1);
  }
  Throw("region out-of-bounds",0x5d);
}

Assistant:

void Memcpy(uint64_t offset, std::string_view* out_range, T* out) const {
      std::string_view range = StrictSubstr(data_, offset, sizeof(*out));
      if (out_range) {
        *out_range = range;
      }
      memcpy(out, data_.data() + offset, sizeof(*out));
    }